

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_significand<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point)

{
  basic_appender<char> out_00;
  basic_appender<char> local_30;
  
  out_00 = copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                     (significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    local_30 = out_00;
    basic_appender<char>::operator=(&local_30,decimal_point);
    out_00 = copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                       (significand + integral_size,significand + significand_size,out_00);
  }
  return (basic_appender<char>)out_00.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_noinline<Char>(significand, significand + integral_size,
                                    out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_noinline<Char>(significand + integral_size,
                                     significand + significand_size, out);
}